

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O2

Error __thiscall asmjit::VMemMgr::shrink(VMemMgr *this,void *p,size_t used)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Error EVar3;
  MemNode *pMVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  
  if (p == (void *)0x0) {
    return 0;
  }
  if (used == 0) {
    EVar3 = release(this,p);
    return EVar3;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  pMVar4 = vMemMgrFindNodeByPtr(this,(uint8_t *)p);
  if (pMVar4 != (MemNode *)0x0) {
    uVar6 = pMVar4->density;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)p - (long)(pMVar4->super_RbNode).mem;
    uVar7 = SUB168(auVar2 / auVar1,0) >> 3 & 0xfffffffffffffff8;
    puVar9 = (ulong *)((long)pMVar4->baUsed + uVar7);
    puVar8 = (ulong *)(uVar7 + (long)pMVar4->baCont);
    uVar10 = 0;
    uVar7 = 1L << (SUB161(auVar2 / auVar1,0) & 0x3f);
    do {
      uVar11 = *puVar8;
      do {
        if ((uVar7 & uVar11) == 0) goto LAB_00112b90;
        uVar10 = uVar10 + 1;
        if (((used + uVar6) - 1) / uVar6 == uVar10) {
          uVar6 = *puVar9;
          lVar5 = 0;
          bVar12 = false;
          goto LAB_00112b29;
        }
        uVar7 = uVar7 * 2;
      } while (uVar7 != 0);
      puVar9 = puVar9 + 1;
      puVar8 = puVar8 + 1;
      uVar7 = 1;
    } while( true );
  }
  EVar3 = 3;
LAB_00112b92:
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return EVar3;
LAB_00112b29:
  uVar11 = ~uVar7 & uVar11;
  uVar7 = uVar7 * 2;
  if (uVar7 == 0 || bVar12) {
    *puVar9 = uVar6;
    *puVar8 = uVar11;
    if (bVar12) goto LAB_00112b79;
    uVar6 = puVar9[1];
    puVar9 = puVar9 + 1;
    uVar11 = puVar8[1];
    puVar8 = puVar8 + 1;
    uVar7 = 1;
  }
  bVar12 = (uVar7 & uVar11) == 0;
  uVar6 = uVar6 & ~uVar7;
  lVar5 = lVar5 + 1;
  goto LAB_00112b29;
LAB_00112b79:
  uVar6 = lVar5 * pMVar4->density;
  if (pMVar4->largestBlock < uVar6) {
    pMVar4->largestBlock = uVar6;
  }
  pMVar4->used = pMVar4->used - uVar6;
  this->_usedBytes = this->_usedBytes - uVar6;
LAB_00112b90:
  EVar3 = 0;
  goto LAB_00112b92;
}

Assistant:

Error VMemMgr::shrink(void* p, size_t used) noexcept {
  if (!p) return kErrorOk;
  if (used == 0)
    return release(p);

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, (uint8_t*)p);
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  size_t usedBlocks = (used + node->density - 1) / node->density;

  bool stop;

  // Find the first block we can mark as free.
  for (;;) {
    stop = (cbits & bit) == 0;
    if (stop)
      return kErrorOk;

    if (++cont == usedBlocks)
      break;

    bit <<= 1;
    if (bit == 0) {
      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Free the tail blocks.
  cont = ~(size_t)0;
  goto _EnterFreeLoop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;

_EnterFreeLoop:
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  return kErrorOk;
}